

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O1

Iterator * __thiscall leveldb::VersionSet::MakeInputIterator(VersionSet *this,Compaction *c)

{
  vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *pvVar1;
  Iterator **children;
  pointer ppFVar2;
  Iterator *pIVar3;
  long lVar4;
  int n;
  ulong uVar5;
  long lVar6;
  bool bVar7;
  ReadOptions options;
  ReadOptions local_50;
  ulong local_40;
  _func_int **local_38;
  
  local_50.snapshot = (Snapshot *)0x0;
  local_50.fill_cache = false;
  local_50.verify_checksums = this->options_->paranoid_checks;
  local_40 = 2;
  if (c->level_ == 0) {
    local_40 = (ulong)((int)((ulong)((long)c->inputs_[0].
                                           super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)c->inputs_[0].
                                          super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                                          ._M_impl.super__Vector_impl_data._M_start) >> 3) + 1);
  }
  uVar5 = 0xffffffffffffffff;
  if (-1 < (int)local_40) {
    uVar5 = (long)(int)local_40 * 8;
  }
  children = (Iterator **)operator_new__(uVar5);
  local_38 = (_func_int **)&PTR__Comparator_0017f5b0;
  n = 0;
  lVar6 = 0;
  do {
    if (c->inputs_[lVar6].
        super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        c->inputs_[lVar6].
        super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      pvVar1 = c->inputs_ + lVar6;
      if (c->level_ + (int)lVar6 == 0) {
        ppFVar2 = (pvVar1->
                  super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        if ((pvVar1->
            super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>).
            _M_impl.super__Vector_impl_data._M_finish != ppFVar2) {
          uVar5 = 0;
          do {
            pIVar3 = TableCache::NewIterator
                               (this->table_cache_,&local_50,ppFVar2[uVar5]->number,
                                ppFVar2[uVar5]->file_size,(Table **)0x0);
            children[(long)n + uVar5] = pIVar3;
            uVar5 = uVar5 + 1;
            ppFVar2 = (pvVar1->
                      super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                      )._M_impl.super__Vector_impl_data._M_start;
          } while (uVar5 < (ulong)((long)(pvVar1->
                                         super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                                         )._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar2
                                  >> 3));
          n = n + (int)uVar5;
        }
      }
      else {
        pIVar3 = (Iterator *)operator_new(0x58);
        Iterator::Iterator(pIVar3);
        pIVar3->_vptr_Iterator = (_func_int **)&PTR__LevelFileNumIterator_0017f6e0;
        pIVar3[1]._vptr_Iterator = local_38;
        pIVar3[1].cleanup_head_.function = (CleanupFunction)(this->icmp_).user_comparator_;
        pIVar3[1].cleanup_head_.arg1 = pvVar1;
        *(int *)&pIVar3[1].cleanup_head_.arg2 =
             (int)((ulong)((long)(pvVar1->
                                 super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                                 )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(pvVar1->
                                super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                                )._M_impl.super__Vector_impl_data._M_start) >> 3);
        pIVar3 = NewTwoLevelIterator(pIVar3,GetFileIterator,this->table_cache_,&local_50);
        lVar4 = (long)n;
        n = n + 1;
        children[lVar4] = pIVar3;
      }
    }
    bVar7 = lVar6 == 0;
    lVar6 = lVar6 + 1;
  } while (bVar7);
  if ((int)local_40 < n) {
    __assert_fail("num <= space",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/version_set.cc"
                  ,0x4d9,"Iterator *leveldb::VersionSet::MakeInputIterator(Compaction *)");
  }
  pIVar3 = NewMergingIterator(&(this->icmp_).super_Comparator,children,n);
  operator_delete__(children);
  return pIVar3;
}

Assistant:

Iterator* VersionSet::MakeInputIterator(Compaction* c) {
  ReadOptions options;
  options.verify_checksums = options_->paranoid_checks;
  options.fill_cache = false;

  // Level-0 files have to be merged together.  For other levels,
  // we will make a concatenating iterator per level.
  // TODO(opt): use concatenating iterator for level-0 if there is no overlap
  const int space = (c->level() == 0 ? c->inputs_[0].size() + 1 : 2);
  Iterator** list = new Iterator*[space];
  int num = 0;
  for (int which = 0; which < 2; which++) {
    if (!c->inputs_[which].empty()) {
      if (c->level() + which == 0) {
        const std::vector<FileMetaData*>& files = c->inputs_[which];
        for (size_t i = 0; i < files.size(); i++) {
          list[num++] = table_cache_->NewIterator(options, files[i]->number,
                                                  files[i]->file_size);
        }
      } else {
        // Create concatenating iterator for the files from this level
        list[num++] = NewTwoLevelIterator(
            new Version::LevelFileNumIterator(icmp_, &c->inputs_[which]),
            &GetFileIterator, table_cache_, options);
      }
    }
  }
  assert(num <= space);
  Iterator* result = NewMergingIterator(&icmp_, list, num);
  delete[] list;
  return result;
}